

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O2

bool __thiscall
cmGetPropertyCommand::InitialPass
          (cmGetPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  string *name_00;
  OutType OVar1;
  pointer pbVar2;
  bool bVar3;
  cmState *pcVar4;
  cmPropertyDefinition *pcVar5;
  ostream *poVar6;
  ScopeType SVar7;
  char *value;
  ScopeType SVar8;
  string *psVar9;
  ulong uVar10;
  ScopeType SStack_200;
  string local_1d0;
  string *local_1b0;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    std::__cxx11::string::string
              ((string *)&e,"called with incorrect number of arguments",(allocator *)&local_1d0);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
  }
  else {
    name = &this->Variable;
    std::__cxx11::string::_M_assign((string *)name);
    bVar3 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"GLOBAL");
    if (bVar3) {
      SStack_200 = GLOBAL;
    }
    else {
      bVar3 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1,"DIRECTORY");
      SStack_200 = DIRECTORY;
      if (!bVar3) {
        bVar3 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1,"TARGET");
        SStack_200 = TARGET;
        if (!bVar3) {
          bVar3 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1,"SOURCE");
          SStack_200 = SOURCE_FILE;
          if (!bVar3) {
            bVar3 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 1,"TEST");
            if (bVar3) {
              SStack_200 = TEST;
            }
            else {
              bVar3 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 1,"VARIABLE");
              if (bVar3) {
                SStack_200 = VARIABLE;
              }
              else {
                bVar3 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 1,"CACHE");
                if (bVar3) {
                  SStack_200 = CACHE;
                }
                else {
                  bVar3 = std::operator==((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + 1,"INSTALL");
                  if (!bVar3) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                    poVar6 = std::operator<<((ostream *)&e,"given invalid scope ");
                    poVar6 = std::operator<<(poVar6,(string *)
                                                    ((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1));
                    poVar6 = std::operator<<(poVar6,".  ");
                    poVar6 = std::operator<<(poVar6,"Valid scopes are ");
                    std::operator<<(poVar6,
                                    "GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL."
                                   );
                    std::__cxx11::stringbuf::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_1d0);
LAB_0031b6f3:
                    std::__cxx11::string::~string((string *)&local_1d0);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
                    return false;
                  }
                  SStack_200 = INSTALL;
                }
              }
            }
          }
        }
      }
    }
    name_00 = &this->PropertyName;
    local_1b0 = (string *)&this->Name;
    SVar8 = SOURCE_FILE;
    for (uVar10 = 2;
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar10 < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
        uVar10 = (ulong)((int)uVar10 + 1)) {
      bVar3 = std::operator==(pbVar2 + uVar10,"PROPERTY");
      SVar7 = DIRECTORY;
      if (!bVar3) {
        bVar3 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar10,"BRIEF_DOCS");
        if (bVar3) {
          this->InfoType = OutBriefDoc;
        }
        else {
          bVar3 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar10,"FULL_DOCS");
          if (bVar3) {
            this->InfoType = OutFullDoc;
          }
          else {
            bVar3 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10,"SET");
            if (bVar3) {
              this->InfoType = OutSet;
            }
            else {
              bVar3 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar10,"DEFINED")
              ;
              if (bVar3) {
                this->InfoType = OutDefined;
              }
              else {
                psVar9 = (string *)name_00;
                if ((SVar8 != DIRECTORY) && (psVar9 = local_1b0, SVar8 != SOURCE_FILE)) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
                  poVar6 = std::operator<<((ostream *)&e,"given invalid argument \"");
                  poVar6 = std::operator<<(poVar6,(string *)
                                                  ((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar10));
                  std::operator<<(poVar6,"\".");
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_1d0);
                  goto LAB_0031b6f3;
                }
                std::__cxx11::string::_M_assign(psVar9);
              }
            }
          }
        }
        SVar7 = TARGET;
      }
      SVar8 = SVar7;
    }
    if ((this->PropertyName)._M_string_length != 0) {
      OVar1 = this->InfoType;
      if (OVar1 == OutDefined) {
        pcVar4 = cmMakefile::GetState((this->super_cmCommand).Makefile);
        pcVar5 = cmState::GetPropertyDefinition(pcVar4,name_00,SStack_200);
        if (pcVar5 == (cmPropertyDefinition *)0x0) {
          value = "0";
        }
        else {
          value = "1";
        }
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,value);
      }
      else {
        if (OVar1 == OutFullDoc) {
          _e = (pointer)local_198;
          local_198[0]._M_local_buf[0] = '\0';
          pcVar4 = cmMakefile::GetState((this->super_cmCommand).Makefile);
          pcVar5 = cmState::GetPropertyDefinition(pcVar4,name_00,SStack_200);
          if (pcVar5 == (cmPropertyDefinition *)0x0) {
            std::__cxx11::string::assign((char *)&e);
          }
          else {
            std::__cxx11::string::_M_assign((string *)&e);
          }
          cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,_e);
        }
        else {
          if (OVar1 != OutBriefDoc) {
            switch(SStack_200) {
            case TARGET:
              bVar3 = HandleTargetMode(this);
              return bVar3;
            case SOURCE_FILE:
              bVar3 = HandleSourceMode(this);
              return bVar3;
            case DIRECTORY:
              bVar3 = HandleDirectoryMode(this);
              return bVar3;
            case GLOBAL:
              bVar3 = HandleGlobalMode(this);
              return bVar3;
            case CACHE:
              bVar3 = HandleCacheMode(this);
              return bVar3;
            case TEST:
              bVar3 = HandleTestMode(this);
              return bVar3;
            case VARIABLE:
              bVar3 = HandleVariableMode(this);
              return bVar3;
            default:
              return true;
            case INSTALL:
              bVar3 = HandleInstallMode(this);
              return bVar3;
            }
          }
          _e = (pointer)local_198;
          local_198[0]._M_local_buf[0] = '\0';
          pcVar4 = cmMakefile::GetState((this->super_cmCommand).Makefile);
          pcVar5 = cmState::GetPropertyDefinition(pcVar4,name_00,SStack_200);
          if (pcVar5 == (cmPropertyDefinition *)0x0) {
            std::__cxx11::string::assign((char *)&e);
          }
          else {
            std::__cxx11::string::_M_assign((string *)&e);
          }
          cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,_e);
        }
        std::__cxx11::string::~string((string *)&e);
      }
      return true;
    }
    std::__cxx11::string::string
              ((string *)&e,"not given a PROPERTY <name> argument.",(allocator *)&local_1d0);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
  }
  std::__cxx11::string::~string((string *)&e);
  return false;
}

Assistant:

bool cmGetPropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 3 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // The cmake variable in which to store the result.
  this->Variable = args[0];

  // Get the scope from which to get the property.
  cmProperty::ScopeType scope;
  if(args[1] == "GLOBAL")
    {
    scope = cmProperty::GLOBAL;
    }
  else if(args[1] == "DIRECTORY")
    {
    scope = cmProperty::DIRECTORY;
    }
  else if(args[1] == "TARGET")
    {
    scope = cmProperty::TARGET;
    }
  else if(args[1] == "SOURCE")
    {
    scope = cmProperty::SOURCE_FILE;
    }
  else if(args[1] == "TEST")
    {
    scope = cmProperty::TEST;
    }
  else if(args[1] == "VARIABLE")
    {
    scope = cmProperty::VARIABLE;
    }
  else if(args[1] == "CACHE")
    {
    scope = cmProperty::CACHE;
    }
  else if(args[1] == "INSTALL")
    {
    scope = cmProperty::INSTALL;
    }
  else
    {
    std::ostringstream e;
    e << "given invalid scope " << args[1] << ".  "
      << "Valid scopes are "
      << "GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL.";
    this->SetError(e.str());
    return false;
    }

  // Parse remaining arguments.
  enum Doing { DoingNone, DoingName, DoingProperty, DoingType };
  Doing doing = DoingName;
  for(unsigned int i=2; i < args.size(); ++i)
    {
    if(args[i] == "PROPERTY")
      {
      doing = DoingProperty;
      }
    else if(args[i] == "BRIEF_DOCS")
      {
      doing = DoingNone;
      this->InfoType = OutBriefDoc;
      }
    else if(args[i] == "FULL_DOCS")
      {
      doing = DoingNone;
      this->InfoType = OutFullDoc;
      }
    else if(args[i] == "SET")
      {
      doing = DoingNone;
      this->InfoType = OutSet;
      }
    else if(args[i] == "DEFINED")
      {
      doing = DoingNone;
      this->InfoType = OutDefined;
      }
    else if(doing == DoingName)
      {
      doing = DoingNone;
      this->Name = args[i];
      }
    else if(doing == DoingProperty)
      {
      doing = DoingNone;
      this->PropertyName = args[i];
      }
    else
      {
      std::ostringstream e;
      e << "given invalid argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
      }
    }

  // Make sure a property name was found.
  if(this->PropertyName.empty())
    {
    this->SetError("not given a PROPERTY <name> argument.");
    return false;
    }

  // Compute requested output.
  if(this->InfoType == OutBriefDoc)
    {
    // Lookup brief documentation.
    std::string output;
    if(cmPropertyDefinition const* def = this->Makefile->GetState()->
       GetPropertyDefinition(this->PropertyName, scope))
      {
      output = def->GetShortDescription();
      }
    else
      {
      output = "NOTFOUND";
      }
    this->Makefile->AddDefinition(this->Variable, output.c_str());
    }
  else if(this->InfoType == OutFullDoc)
    {
    // Lookup full documentation.
    std::string output;
    if(cmPropertyDefinition const* def = this->Makefile->GetState()->
       GetPropertyDefinition(this->PropertyName, scope))
      {
      output = def->GetFullDescription();
      }
    else
      {
      output = "NOTFOUND";
      }
    this->Makefile->AddDefinition(this->Variable, output.c_str());
    }
  else if(this->InfoType == OutDefined)
    {
    // Lookup if the property is defined
    if(this->Makefile->GetState()->
       GetPropertyDefinition(this->PropertyName, scope))
      {
      this->Makefile->AddDefinition(this->Variable, "1");
      }
    else
      {
      this->Makefile->AddDefinition(this->Variable, "0");
      }
    }
  else
    {
    // Dispatch property getting.
    switch(scope)
      {
      case cmProperty::GLOBAL:      return this->HandleGlobalMode();
      case cmProperty::DIRECTORY:   return this->HandleDirectoryMode();
      case cmProperty::TARGET:      return this->HandleTargetMode();
      case cmProperty::SOURCE_FILE: return this->HandleSourceMode();
      case cmProperty::TEST:        return this->HandleTestMode();
      case cmProperty::VARIABLE:    return this->HandleVariableMode();
      case cmProperty::CACHE:       return this->HandleCacheMode();
      case cmProperty::INSTALL:       return this->HandleInstallMode();

      case cmProperty::CACHED_VARIABLE:
        break; // should never happen
      }
    }

  return true;
}